

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O0

void ut11::Assert::That<char[16],ut11::Operands::IsStringBeginningWith>
               (size_t line,string *file,char (*expected) [16],IsStringBeginningWith *operand)

{
  string *actual;
  IsStringBeginningWith *pIVar1;
  string *line_00;
  bool bVar2;
  allocator local_c1;
  string local_c0 [32];
  IsStringBeginningWith local_a0;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  string *local_28;
  IsStringBeginningWith *operand_local;
  char (*expected_local) [16];
  string *file_local;
  size_t line_local;
  
  local_28 = &operand->m_expected;
  operand_local = (IsStringBeginningWith *)expected;
  expected_local = (char (*) [16])file;
  file_local = (string *)line;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,*expected,&local_49);
  bVar2 = Operands::IsStringBeginningWith::operator()(operand,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  line_00 = file_local;
  if (!bVar2) {
    std::__cxx11::string::string(local_80,(string *)file);
    pIVar1 = operand_local;
    actual = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,(char *)pIVar1,&local_c1);
    Operands::IsStringBeginningWith::GetErrorMessage(&local_a0,actual);
    Fail((size_t)line_00,(string *)local_80,&local_a0.m_expected);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}